

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *p_v,void *p_min,void *p_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined2 *in_RCX;
  undefined4 in_EDX;
  uint in_stack_00000010;
  bool r_3;
  ImU32 v32_3;
  bool r_2;
  ImS32 v32_2;
  bool r_1;
  ImU32 v32_1;
  bool r;
  ImS32 v32;
  ImGuiContext *g;
  undefined4 in_stack_00000070;
  ImGuiSliderFlags in_stack_00000074;
  ImGuiSliderFlags in_stack_00000078;
  undefined4 in_stack_0000007c;
  ImGuiID in_stack_0000008c;
  ImGuiDataType in_stack_00000098;
  ImGuiID in_stack_0000009c;
  ImRect *in_stack_000000a0;
  ImGuiSliderFlags in_stack_000000a8;
  ImRect *in_stack_000000b0;
  bool local_1;
  
  if ((((GImGui->CurrentWindow->DC).ItemFlags & 0x80U) == 0) &&
     ((in_stack_00000010 & 0x200000) == 0)) {
    switch(in_EDX) {
    case 0:
      uVar1 = *(undefined1 *)in_RCX;
      local_1 = SliderBehaviorT<int,int,float>
                          ((ImRect *)CONCAT44(id,data_type),(ImGuiID)p_v._4_4_,
                           (ImGuiDataType)p_v._0_4_,(int *)p_min,p_max._4_4_,(uint)p_max,
                           (char *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_00000078,
                           (ImRect *)format);
      if (local_1) {
        *(undefined1 *)in_RCX = uVar1;
      }
      break;
    case 1:
      uVar1 = *(undefined1 *)in_RCX;
      local_1 = SliderBehaviorT<unsigned_int,int,float>
                          ((ImRect *)CONCAT44(id,data_type),(ImGuiID)p_v._4_4_,
                           (ImGuiDataType)p_v._0_4_,(uint *)p_min,p_max._4_4_,(uint)p_max,
                           (char *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_00000078,
                           (ImRect *)format);
      if (local_1) {
        *(undefined1 *)in_RCX = uVar1;
      }
      break;
    case 2:
      uVar2 = *in_RCX;
      local_1 = SliderBehaviorT<int,int,float>
                          ((ImRect *)CONCAT44(id,data_type),(ImGuiID)p_v._4_4_,
                           (ImGuiDataType)p_v._0_4_,(int *)p_min,p_max._4_4_,(uint)p_max,
                           (char *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_00000078,
                           (ImRect *)format);
      if (local_1) {
        *in_RCX = uVar2;
      }
      break;
    case 3:
      uVar2 = *in_RCX;
      local_1 = SliderBehaviorT<unsigned_int,int,float>
                          ((ImRect *)CONCAT44(id,data_type),(ImGuiID)p_v._4_4_,
                           (ImGuiDataType)p_v._0_4_,(uint *)p_min,p_max._4_4_,(uint)p_max,
                           (char *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_00000078,
                           (ImRect *)format);
      if (local_1) {
        *in_RCX = uVar2;
      }
      break;
    case 4:
      local_1 = SliderBehaviorT<int,int,float>
                          ((ImRect *)CONCAT44(id,data_type),(ImGuiID)p_v._4_4_,
                           (ImGuiDataType)p_v._0_4_,(int *)p_min,p_max._4_4_,(uint)p_max,
                           (char *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_00000078,
                           (ImRect *)format);
      break;
    case 5:
      local_1 = SliderBehaviorT<unsigned_int,int,float>
                          ((ImRect *)CONCAT44(id,data_type),(ImGuiID)p_v._4_4_,
                           (ImGuiDataType)p_v._0_4_,(uint *)p_min,p_max._4_4_,(uint)p_max,
                           (char *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_00000078,
                           (ImRect *)format);
      break;
    case 6:
      local_1 = SliderBehaviorT<long_long,long_long,double>
                          (out_grab_bb,in_stack_0000008c,flags,(longlong *)format,
                           CONCAT44(in_stack_0000007c,in_stack_00000078),
                           CONCAT44(in_stack_00000074,in_stack_00000070),(char *)in_stack_000000a0,
                           in_stack_000000a8,in_stack_000000b0);
      break;
    case 7:
      local_1 = SliderBehaviorT<unsigned_long_long,long_long,double>
                          (out_grab_bb,in_stack_0000008c,flags,(unsigned_long_long *)format,
                           CONCAT44(in_stack_0000007c,in_stack_00000078),
                           CONCAT44(in_stack_00000074,in_stack_00000070),(char *)in_stack_000000a0,
                           in_stack_000000a8,in_stack_000000b0);
      break;
    case 8:
      local_1 = SliderBehaviorT<float,float,float>
                          ((ImRect *)CONCAT44(in_stack_00000074,in_stack_00000070),bb._4_4_,
                           (ImGuiDataType)bb,(float *)CONCAT44(id,data_type),p_v._4_4_,p_v._0_4_,
                           (char *)p_min,p_max._4_4_,(ImRect *)format);
      break;
    case 9:
      local_1 = SliderBehaviorT<double,double,double>
                          (in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                           (double *)out_grab_bb,(double)CONCAT44(in_stack_0000008c,flags),
                           (double)format,(char *)CONCAT44(in_stack_0000007c,in_stack_00000078),
                           in_stack_00000074,in_stack_000000b0);
      break;
    case 10:
    default:
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* p_v, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    // Read imgui.cpp "API BREAKING CHANGES" section for 1.78 if you hit this assert.
    IM_ASSERT((flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && "Invalid ImGuiSliderFlags flag!  Has the 'float power' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.");

    ImGuiContext& g = *GImGui;
    if ((g.CurrentWindow->DC.ItemFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:  { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS8*)p_min,  *(const ImS8*)p_max,  format, flags, out_grab_bb); if (r) *(ImS8*)p_v  = (ImS8)v32;  return r; }
    case ImGuiDataType_U8:  { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU8*)p_min,  *(const ImU8*)p_max,  format, flags, out_grab_bb); if (r) *(ImU8*)p_v  = (ImU8)v32;  return r; }
    case ImGuiDataType_S16: { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS16*)p_min, *(const ImS16*)p_max, format, flags, out_grab_bb); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16: { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU16*)p_min, *(const ImU16*)p_max, format, flags, out_grab_bb); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)p_min >= IM_S32_MIN / 2 && *(const ImS32*)p_max <= IM_S32_MAX / 2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)p_v,  *(const ImS32*)p_min,  *(const ImS32*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)p_max <= IM_U32_MAX / 2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)p_v,  *(const ImU32*)p_min,  *(const ImU32*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)p_min >= IM_S64_MIN / 2 && *(const ImS64*)p_max <= IM_S64_MAX / 2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)p_v,  *(const ImS64*)p_min,  *(const ImS64*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)p_max <= IM_U64_MAX / 2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)p_v,  *(const ImU64*)p_min,  *(const ImU64*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)p_min >= -FLT_MAX / 2.0f && *(const float*)p_max <= FLT_MAX / 2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)p_v,  *(const float*)p_min,  *(const float*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)p_min >= -DBL_MAX / 2.0f && *(const double*)p_max <= DBL_MAX / 2.0f);
        return SliderBehaviorT<double, double, double>(bb, id, data_type, (double*)p_v, *(const double*)p_min, *(const double*)p_max, format, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}